

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::
CmpHelperEQFailure<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>,std::pair<int_const,int>&,std::pair<int_const,int>*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>const,std::pair<int_const,int>const&,std::pair<int_const,int>const*>>
          (internal *this,char *lhs_expression,char *rhs_expression,
          btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
          *lhs,btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_const_std::pair<const_int,_int>_&,_const_std::pair<const_int,_int>_*>
               *rhs)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar1;
  string local_70;
  string local_50;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_const_std::pair<const_int,_int>_&,_const_std::pair<const_int,_int>_*>
  *local_30;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_const_std::pair<const_int,_int>_&,_const_std::pair<const_int,_int>_*>
  *rhs_local;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
  *lhs_local;
  char *rhs_expression_local;
  char *lhs_expression_local;
  
  local_30 = rhs;
  rhs_local = (btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_const_std::pair<const_int,_int>_&,_const_std::pair<const_int,_int>_*>
               *)lhs;
  lhs_local = (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
               *)rhs_expression;
  rhs_expression_local = lhs_expression;
  lhs_expression_local = (char *)this;
  FormatForComparisonFailureMessage<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>,std::pair<int_const,int>&,std::pair<int_const,int>*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>const,std::pair<int_const,int>const&,std::pair<int_const,int>const*>>
            (&local_50,(internal *)lhs,
             (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
              *)rhs,(btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_const_std::pair<const_int,_int>_&,_const_std::pair<const_int,_int>_*>
                     *)lhs);
  FormatForComparisonFailureMessage<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>const,std::pair<int_const,int>const&,std::pair<int_const,int>const*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>,std::pair<int_const,int>&,std::pair<int_const,int>*>>
            (&local_70,(internal *)local_30,rhs_local,lhs);
  EqFailure(this,lhs_expression,rhs_expression,&local_50,&local_70,false);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  AVar1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression, const T1& lhs,
                                   const T2& rhs) {
  return EqFailure(lhs_expression, rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs), false);
}